

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way<false,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  size_t __n;
  uchar **strings_output_00;
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  bool bVar4;
  MergeResult MVar5;
  ostream *poVar6;
  ostream *poVar7;
  MergeResult MVar8;
  uchar *puVar9;
  uint uVar10;
  uchar **ppuVar11;
  lcp_t *plVar12;
  ulong uVar13;
  lcp_t *plVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  size_t i_1;
  lcp_t lVar18;
  lcp_t in_R11;
  uchar *cache_input1;
  ptrdiff_t _Num;
  ulong uVar19;
  char local_8d;
  MergeResult local_8c;
  uchar *local_88;
  lcp_t *local_80;
  size_t local_78;
  lcp_t *local_70;
  lcp_t *local_68;
  uchar **local_60;
  uchar **local_58;
  uchar *local_50;
  uchar **local_48;
  uchar *local_40;
  ulong local_38;
  
  local_70 = lcp_output;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"mergesort_cache_lcp_2way",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(): n=",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_8d = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_8d,1);
  plVar12 = local_70;
  if (0x1f < n) {
    uVar19 = n >> 1;
    MVar5 = mergesort_cache_lcp_2way<true,unsigned_char>
                      (strings_input,strings_output,lcp_input,local_70,cache_input,cache_output,
                       uVar19);
    puVar9 = cache_input;
    plVar14 = lcp_input;
    ppuVar11 = strings_input;
    if (MVar5 != SortedInPlace) {
      puVar9 = cache_output;
      plVar14 = plVar12;
      ppuVar11 = strings_output;
    }
    check_input<unsigned_char>(ppuVar11,plVar14,puVar9,uVar19);
    ppuVar11 = strings_input + uVar19;
    strings_output_00 = strings_output + uVar19;
    plVar14 = lcp_input + uVar19;
    local_80 = plVar12 + uVar19;
    puVar9 = cache_input + uVar19;
    local_40 = cache_output + uVar19;
    local_78 = n - uVar19;
    local_88 = cache_input;
    local_48 = strings_output;
    local_38 = uVar19;
    local_8c = mergesort_cache_lcp_2way<true,unsigned_char>
                         (ppuVar11,strings_output_00,plVar14,local_80,puVar9,local_40,local_78);
    cache_input1 = local_40;
    plVar12 = local_80;
    local_68 = plVar14;
    local_60 = strings_output_00;
    local_58 = ppuVar11;
    local_50 = puVar9;
    if (MVar5 == SortedInPlace) {
      check_input<unsigned_char>(ppuVar11,plVar14,puVar9,local_78);
      plVar12 = local_80;
      cache_input1 = local_40;
    }
    else {
      check_input<unsigned_char>(strings_output_00,local_80,local_40,local_78);
    }
    uVar19 = local_38;
    ppuVar11 = local_48;
    MVar8 = local_8c;
    if (MVar5 != local_8c) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Warning: extra copying due to m0 != m1. n=",0x2a);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      ppuVar11 = local_48;
      __n = uVar19 * 8;
      if (MVar5 == SortedInPlace) {
        memmove(local_48,strings_input,__n);
        memcpy(cache_output,local_88,uVar19);
        memcpy(local_70,lcp_input,__n);
        MVar5 = SortedInTemp;
        plVar12 = local_80;
        MVar8 = local_8c;
      }
      else {
        memmove(strings_input,local_48,__n);
        memcpy(local_88,cache_output,uVar19);
        memcpy(lcp_input,local_70,__n);
        plVar12 = local_80;
        MVar8 = SortedInTemp;
      }
    }
    if (MVar5 == MVar8) {
      if (MVar5 != SortedInPlace) {
        merge_cache_lcp_2way<false,unsigned_char>
                  (ppuVar11,local_70,cache_output,uVar19,local_60,plVar12,cache_input1,local_78,
                   strings_input,lcp_input,local_88);
        return SortedInPlace;
      }
      merge_cache_lcp_2way<false,unsigned_char>
                (strings_input,lcp_input,local_88,uVar19,local_58,local_68,local_50,local_78,
                 ppuVar11,local_70,cache_output);
      return SortedInTemp;
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned char]"
                 );
  }
  if (1 < (long)n) {
    uVar19 = n & 0xffffffff;
    poVar7 = (ostream *)strings_input;
    do {
      iVar3 = (int)uVar19;
      uVar19 = (ulong)(iVar3 - 1);
      pbVar1 = *(byte **)(poVar7 + 8);
      poVar7 = poVar7 + 8;
      for (poVar6 = poVar7; strings_input < poVar6; poVar6 = poVar6 + -8) {
        pbVar2 = *(byte **)(poVar6 + -8);
        bVar15 = *pbVar2;
        bVar16 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar15 != bVar16);
        if (bVar15 != 0 && bVar15 == bVar16) {
          in_R11 = 1;
          do {
            bVar15 = pbVar2[in_R11];
            bVar16 = pbVar1[in_R11];
            if (bVar15 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar15 == bVar16);
        }
        if (bVar15 <= bVar16) break;
        *(byte **)poVar6 = pbVar2;
      }
      *(byte **)poVar6 = pbVar1;
    } while (2 < iVar3);
  }
  puVar9 = *strings_input;
  lVar17 = 0;
  poVar7 = (ostream *)0x0;
  do {
    if ((puVar9[lVar17] == '\0') || (puVar9[lVar17] != strings_input[1][lVar17])) {
      bVar4 = false;
      poVar6 = poVar7;
    }
    else {
      poVar7 = poVar7 + 1;
      bVar4 = true;
    }
    lVar17 = lVar17 + 1;
  } while (bVar4);
  *lcp_input = (lcp_t)poVar6;
  if (puVar9 != (uchar *)0x0) {
    *cache_input = *puVar9;
    if (1 < n - 1) {
      uVar19 = 1;
      uVar10 = 1;
      do {
        puVar9 = strings_input[uVar19];
        uVar13 = (ulong)(uVar10 + 1);
        lVar17 = 0;
        lVar18 = 0;
        do {
          if ((puVar9[lVar17] == '\0') || (puVar9[lVar17] != strings_input[uVar13][lVar17])) {
            bVar4 = false;
            in_R11 = lVar18;
          }
          else {
            lVar18 = lVar18 + 1;
            bVar4 = true;
          }
          lVar17 = lVar17 + 1;
        } while (bVar4);
        lcp_input[uVar19] = in_R11;
        if (puVar9 == (uchar *)0x0) goto LAB_00242d4d;
        cache_input[uVar19] = puVar9[lcp_input[uVar10 - 1]];
        uVar19 = uVar13;
        uVar10 = uVar10 + 1;
      } while (uVar13 < n - 1);
    }
    if (strings_input[n - 1] != (uchar *)0x0) {
      cache_input[n - 1] = strings_input[n - 1][lcp_input[n - 2]];
      check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_00242d4d:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x26,"unsigned char get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}